

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableGenerator.cpp
# Opt level: O0

void ShuffleDeck16_Ref(PCGRandom *prng,uint16_t *deck,uint32_t count)

{
  uint32_t uVar1;
  uint in_EDX;
  uint uVar2;
  undefined2 *in_RSI;
  PCGRandom *in_RDI;
  uint j;
  uint i;
  uint local_18;
  
  *in_RSI = 0;
  for (local_18 = 1; local_18 < in_EDX; local_18 = local_18 + 1) {
    uVar1 = siamese::PCGRandom::Next(in_RDI);
    uVar2 = uVar1 % (local_18 + 1);
    if (uVar2 != local_18) {
      in_RSI[local_18] = in_RSI[uVar2];
    }
    in_RSI[uVar2] = (short)local_18;
  }
  return;
}

Assistant:

void ShuffleDeck16_Ref(
    PCGRandom &prng,
    uint16_t * deck,
    const uint32_t count)
{
#if 1

    deck[0] = 0;

    for (unsigned i = 1; i < count; ++i)
    {
        unsigned j = prng.Next() % (i + 1);
        if (j != i) {
            deck[i] = deck[j];
        }
        deck[j] = (uint16_t)i;
    }

#else

    (void)prng;

    for (unsigned i = 0; i < count; ++i)
    {
        deck[i] = (uint16_t)i;
    }

    // This is even slower
    std::random_shuffle(&deck[0], &deck[count]);

#endif
}